

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<unsigned_int>::test_many<(libdivide::Branching)1>
          (DivideTest<unsigned_int> *this,uint denom)

{
  ulong uVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  divider<unsigned_int,_(libdivide::Branching)1> the_divider;
  string_class local_48;
  
  if (denom != 1) {
    if (denom == 0) {
      fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x3ab,"libdivide_internal_u32_gen",
              "divider must be != 0");
      abort();
    }
    if ((denom - 1 & denom) == 0) {
      the_divider.div.denom.magic = 0;
      bVar3 = 0x1e - (byte)LZCOUNT(denom);
    }
    else {
      bVar3 = (byte)LZCOUNT(denom) ^ 0x1f;
      uVar1 = (ulong)(uint)(1 << (bVar3 & 0x1f)) << 0x20;
      iVar2 = (int)(uVar1 % (ulong)denom);
      the_divider.div.denom.magic =
           (iVar2 < 0 || denom <= (uint)(iVar2 * 2)) + 1 + (int)(uVar1 / denom) * 2;
    }
    the_divider.div.denom.more = bVar3 & 0x1f;
    uVar4 = libdivide::divider<unsigned_int,_(libdivide::Branching)1>::recover(&the_divider);
    if (uVar4 != denom) {
      std::operator<<((ostream *)&std::cerr,"Failed to recover divisor for ");
      testcase_name_abi_cxx11_(&local_48,this,1);
      std::operator<<((ostream *)&std::cerr,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::operator<<((ostream *)&std::cerr,": ");
      std::ostream::operator<<((ostream *)&std::cerr,denom);
      std::operator<<((ostream *)&std::cerr,", but got ");
      std::ostream::operator<<((ostream *)&std::cerr,uVar4);
      std::operator<<((ostream *)&std::cerr,"\n");
      exit(1);
    }
    test_edgecase_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
    test_small_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
    test_pow2_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
    test_allbits_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
    test_random_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
    test_vectordivide_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
  }
  return;
}

Assistant:

void test_many(T denom) {
        // Don't try dividing by 1 with unsigned branchfree
        if (ALGO == BRANCHFREE && !std::numeric_limits<T>::is_signed && denom == 1) {
            return;
        }

        const divider<T, ALGO> the_divider = divider<T, ALGO>(denom);
        T recovered = the_divider.recover();
        if (recovered != denom) {
            PRINT_ERROR(F("Failed to recover divisor for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(recovered);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }

        test_edgecase_numerators(denom, the_divider);
        test_small_numerators(denom, the_divider);
        test_pow2_numerators(denom, the_divider);
        test_allbits_numerators(denom, the_divider);
#if !defined(__AVR__)
        test_random_numerators(denom, the_divider);
        test_vectordivide_numerators(denom, the_divider);
#endif
    }